

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

void cf_aes_decrypt(cf_aes_context *ctx,uint8_t *in,uint8_t *out)

{
  uint uVar1;
  uint uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  uint32_t *puVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint32_t *puVar10;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  uint8_t *local_38;
  
  uVar6 = ctx->rounds;
  if ((uVar6 < 0xf) && ((0x5400U >> (uVar6 & 0x1f) & 1) != 0)) {
    uVar7 = *(uint *)in;
    uVar9 = *(uint *)(in + 4);
    uVar1 = *(uint *)(in + 8);
    uVar2 = *(uint *)(in + 0xc);
    uVar4 = (ulong)(uVar6 * 4);
    puVar5 = ctx->ks + (uVar4 - 4);
    local_48 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18) ^
               ctx->ks[uVar4];
    local_44 = (uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18) ^
               ctx->ks[uVar4 + 1];
    local_40 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) ^
               ctx->ks[uVar4 + 2];
    local_3c = (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ^
               ctx->ks[uVar4 + 3];
    iVar8 = uVar6 - 1;
    puVar3 = out;
    if (iVar8 == 0) {
      puVar10 = ctx->ks + uVar4;
    }
    else {
      do {
        local_38 = puVar3;
        puVar10 = puVar5;
        inv_shift_rows(&local_48);
        inv_sub_block(&local_48);
        local_48 = local_48 ^ *puVar10;
        uVar6 = local_44 ^ puVar10[1];
        uVar9 = local_40 ^ puVar10[2];
        uVar7 = local_3c ^ puVar10[3];
        local_44 = uVar6;
        local_40 = uVar9;
        local_3c = uVar7;
        local_48 = inv_mix_column(local_48);
        local_44 = inv_mix_column(uVar6);
        local_40 = inv_mix_column(uVar9);
        local_3c = inv_mix_column(uVar7);
        puVar5 = puVar10 + -4;
        iVar8 = iVar8 + -1;
        out = local_38;
        puVar3 = local_38;
      } while (iVar8 != 0);
    }
    inv_shift_rows(&local_48);
    inv_sub_block(&local_48);
    uVar6 = local_48 ^ *puVar5;
    local_44 = local_44 ^ puVar10[-3];
    local_40 = local_40 ^ puVar10[-2];
    local_3c = local_3c ^ ((cf_aes_context *)(puVar10 + -1))->rounds;
    *out = (uint8_t)(uVar6 >> 0x18);
    out[1] = (uint8_t)(uVar6 >> 0x10);
    out[2] = (uint8_t)(uVar6 >> 8);
    out[3] = (uint8_t)uVar6;
    out[4] = (uint8_t)(local_44 >> 0x18);
    out[5] = (uint8_t)(local_44 >> 0x10);
    out[6] = (uint8_t)(local_44 >> 8);
    out[7] = (uint8_t)local_44;
    out[8] = (uint8_t)(local_40 >> 0x18);
    out[9] = (uint8_t)(local_40 >> 0x10);
    out[10] = (uint8_t)(local_40 >> 8);
    out[0xb] = (uint8_t)local_40;
    out[0xc] = (uint8_t)(local_3c >> 0x18);
    out[0xd] = (uint8_t)(local_3c >> 0x10);
    out[0xe] = (uint8_t)(local_3c >> 8);
    out[0xf] = (uint8_t)local_3c;
    return;
  }
  abort();
}

Assistant:

void cf_aes_decrypt(const cf_aes_context *ctx,
                    const uint8_t in[AES_BLOCKSZ],
                    uint8_t out[AES_BLOCKSZ])
{
  assert(ctx->rounds == AES128_ROUNDS ||
         ctx->rounds == AES192_ROUNDS ||
         ctx->rounds == AES256_ROUNDS);

  uint32_t state[4] = {
    read32_be(in + 0),
    read32_be(in + 4),
    read32_be(in + 8),
    read32_be(in + 12)
  };

  const uint32_t *round_keys = &ctx->ks[ctx->rounds << 2];
  add_round_key(state, round_keys);
  round_keys -= 4;

  uint32_t round;
  for (round = ctx->rounds - 1; round != 0; round--)
  {
    inv_shift_rows(state);
    inv_sub_block(state);
    add_round_key(state, round_keys);
    inv_mix_columns(state);
    round_keys -= 4;
  }

  inv_shift_rows(state);
  inv_sub_block(state);
  add_round_key(state, round_keys);
  
  write32_be(state[0], out + 0);
  write32_be(state[1], out + 4);
  write32_be(state[2], out + 8);
  write32_be(state[3], out + 12);
}